

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O0

int64_t upb_Message_GetInt64(upb_Message *msg,upb_MiniTableField *f,int64_t default_val)

{
  bool bVar1;
  upb_CType uVar2;
  upb_FieldRep uVar3;
  upb_MessageValue uVar4;
  double local_40;
  upb_MessageValue def;
  int64_t default_val_local;
  upb_MiniTableField *f_local;
  upb_Message *msg_local;
  
  uVar2 = upb_MiniTableField_CType(f);
  if (uVar2 != kUpb_CType_Int64) {
    __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Int64",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x19b,
                  "int64_t upb_Message_GetInt64(const struct upb_Message *, const upb_MiniTableField *, int64_t)"
                 );
  }
  bVar1 = upb_MiniTableField_IsScalar(f);
  if (!bVar1) {
    __assert_fail("upb_MiniTableField_IsScalar(f)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x19c,
                  "int64_t upb_Message_GetInt64(const struct upb_Message *, const upb_MiniTableField *, int64_t)"
                 );
  }
  uVar3 = _upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f);
  if (uVar3 == kUpb_FieldRep_8Byte) {
    uVar4.str_val.size = def.int64_val;
    uVar4.int64_val = default_val;
    uVar4 = upb_Message_GetField(msg,f,uVar4);
    local_40 = uVar4.double_val;
    return (int64_t)local_40;
  }
  __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_8Byte"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x19d,
                "int64_t upb_Message_GetInt64(const struct upb_Message *, const upb_MiniTableField *, int64_t)"
               );
}

Assistant:

UPB_API_INLINE int64_t upb_Message_GetInt64(const struct upb_Message* msg,
                                            const upb_MiniTableField* f,
                                            int64_t default_val) {
  UPB_ASSUME(upb_MiniTableField_CType(f) == kUpb_CType_Int64);
  UPB_ASSUME(upb_MiniTableField_IsScalar(f));
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(f) == kUpb_FieldRep_8Byte);

  upb_MessageValue def;
  def.int64_val = default_val;
  return upb_Message_GetField(msg, f, def).int64_val;
}